

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_parse_expect_semi(JSParseState *s)

{
  JSToken *token;
  byte *p;
  byte bVar1;
  byte bVar2;
  JSFunctionDef *pJVar3;
  uint uVar4;
  int iVar5;
  JSAtom JVar6;
  char *fmt;
  uint uVar7;
  JSValue v;
  byte *pbStack_48;
  BOOL BStack_3c;
  byte *pbStack_38;
  
  iVar5 = (s->token).val;
  if (iVar5 == -0x56) {
    return 0;
  }
  if (iVar5 != 0x3b) {
    if (iVar5 == 0x7d) {
      return 0;
    }
    if (s->got_lf != 0) {
      return 0;
    }
    js_parse_error(s,"expecting \'%c\'",0x3b);
    return -1;
  }
  if (&stack0xfffffffffffffff8 < (undefined1 *)s->ctx->rt->stack_limit) {
    js_parse_error(s,"stack overflow");
    return -1;
  }
  token = &s->token;
  free_token(s,token);
  pbStack_38 = s->buf_ptr;
  s->last_ptr = pbStack_38;
  s->got_lf = 0;
  s->last_line_num = (s->token).line_num;
LAB_0014464c:
  iVar5 = s->line_num;
  (s->token).line_num = iVar5;
  (s->token).ptr = pbStack_38;
  bVar1 = *pbStack_38;
  uVar4 = (uint)bVar1;
  switch(bVar1) {
  case 0:
    uVar7 = 0;
    if (s->buf_end <= pbStack_38) {
      token->val = -0x56;
      goto LAB_00144e9a;
    }
    break;
  default:
    if (-1 < (char)bVar1) goto LAB_0014498c;
    uVar4 = unicode_from_utf8(pbStack_38,6,&pbStack_38);
    if ((uVar4 & 0xfffffffe) == 0x2028) {
      iVar5 = s->line_num;
      goto LAB_0014468c;
    }
    iVar5 = lre_is_space(uVar4);
    if (iVar5 == 0) goto LAB_00144dac;
    goto LAB_0014464c;
  case 9:
  case 0xb:
  case 0xc:
  case 0x20:
    pbStack_38 = pbStack_38 + 1;
    goto LAB_0014464c;
  case 10:
    goto switchD_0014466b_caseD_a;
  case 0xd:
    if (pbStack_38[1] == 10) {
      pbStack_38 = pbStack_38 + 1;
    }
switchD_0014466b_caseD_a:
    pbStack_38 = pbStack_38 + 1;
LAB_0014468c:
    s->got_lf = 1;
    s->line_num = iVar5 + 1;
    goto LAB_0014464c;
  case 0x21:
    if (pbStack_38[1] == 0x3d) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x60;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x61;
      }
      goto LAB_00144e9a;
    }
    uVar7 = 0x21;
    break;
  case 0x22:
  case 0x27:
    iVar5 = js_parse_string(s,(uint)bVar1,1,pbStack_38 + 1,token,&pbStack_38);
    if (iVar5 == 0) goto LAB_00144e9a;
    goto LAB_00144d5b;
  case 0x23:
    p = pbStack_38 + 1;
    pbStack_48 = pbStack_38 + 2;
    bVar1 = pbStack_38[1];
    uVar4 = (uint)bVar1;
    pbStack_38 = p;
    if (bVar1 == 0x5c) {
      if (*pbStack_48 == 0x75) {
        uVar4 = lre_parse_escape(&pbStack_48,1);
      }
      else {
        uVar4 = 0x5c;
      }
    }
    else if ((char)bVar1 < '\0') {
      uVar4 = unicode_from_utf8(p,6,&pbStack_48);
    }
    iVar5 = lre_js_is_ident_first(uVar4);
    if (iVar5 == 0) {
      fmt = "invalid first character of private name";
      goto LAB_00144d51;
    }
    pbStack_38 = pbStack_48;
    JVar6 = parse_ident(s,&pbStack_38,&BStack_3c,uVar4,1);
    if (JVar6 == 0) goto LAB_00144d5b;
    (s->token).u.ident.atom = JVar6;
    (s->token).val = -0x57;
    goto LAB_00144e9a;
  case 0x24:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5f:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
    pbStack_38 = pbStack_38 + 1;
    goto LAB_0014484a;
  case 0x25:
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x79;
      goto LAB_00144e9a;
    }
    uVar7 = 0x25;
    break;
  case 0x26:
    if (pbStack_38[1] == 0x26) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x6f;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x5f;
      }
      goto LAB_00144e9a;
    }
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x73;
      goto LAB_00144e9a;
    }
    uVar7 = 0x26;
    break;
  case 0x2a:
    if (pbStack_38[1] == 0x2a) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x70;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x5d;
      }
      goto LAB_00144e9a;
    }
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x7b;
      goto LAB_00144e9a;
    }
    uVar7 = 0x2a;
    break;
  case 0x2b:
    if (pbStack_38[1] == 0x2b) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x6b;
      goto LAB_00144e9a;
    }
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x78;
      goto LAB_00144e9a;
    }
    uVar7 = 0x2b;
    break;
  case 0x2d:
    if (pbStack_38[1] == 0x2d) {
      if (((s->allow_html_comments != 0) && (pbStack_38[2] == 0x3e)) && (s->last_line_num != iVar5))
      goto LAB_001447ef;
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x6c;
    }
    else {
      if (pbStack_38[1] != 0x3d) goto LAB_0014498c;
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x77;
    }
    goto LAB_00144e9a;
  case 0x2e:
    if (pbStack_38[1] == 0x2e) {
      if (pbStack_38[2] == 0x2e) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x5b;
        goto LAB_00144e9a;
      }
    }
    else if ((byte)(pbStack_38[1] - 0x30) < 10) goto switchD_0014466b_caseD_31;
    uVar7 = 0x2e;
    break;
  case 0x2f:
    bVar1 = pbStack_38[1];
    if (bVar1 != 0x2a) {
      if (bVar1 == 0x2f) {
        pbStack_38 = pbStack_38 + 2;
LAB_001447ef:
        bVar1 = *pbStack_38;
        if (bVar1 == 0) {
          if (pbStack_38 < s->buf_end) goto LAB_00144831;
        }
        else if ((bVar1 != 10) && (bVar1 != 0xd)) {
          if (-1 < (char)bVar1) goto LAB_00144831;
          uVar4 = unicode_from_utf8(pbStack_38,6,&pbStack_38);
          if ((uVar4 & 0xfffffffe) != 0x2028) goto code_r0x00144820;
        }
        goto LAB_0014464c;
      }
      if (bVar1 == 0x3d) {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x7a;
      }
      else {
        pbStack_38 = pbStack_38 + 1;
        token->val = 0x2f;
      }
      goto LAB_00144e9a;
    }
    pbStack_38 = pbStack_38 + 2;
    while (bVar1 = *pbStack_38, bVar1 != 0x2a) {
      if (bVar1 == 10) {
        s->line_num = s->line_num + 1;
LAB_001447b5:
        s->got_lf = 1;
LAB_001447d0:
        pbStack_38 = pbStack_38 + 1;
      }
      else {
        if (bVar1 == 0xd) goto LAB_001447b5;
        if (bVar1 == 0) {
          if (pbStack_38 < s->buf_end) goto LAB_001447d0;
          fmt = "unexpected end of comment";
          goto LAB_00144d51;
        }
        if (-1 < (char)bVar1) goto LAB_001447d0;
        uVar4 = unicode_from_utf8(pbStack_38,6,&pbStack_38);
        if ((uVar4 & 0xfffffffe) == 0x2028) {
          s->got_lf = 1;
        }
        else if (uVar4 == 0xffffffff) goto LAB_001447d0;
      }
    }
    if (pbStack_38[1] != 0x2f) goto LAB_001447d0;
    pbStack_38 = pbStack_38 + 2;
    goto LAB_0014464c;
  case 0x30:
    if ((pbStack_38[1] - 0x3a < 0xfffffff6) || ((s->cur_func->js_mode & 1) == 0))
    goto switchD_0014466b_caseD_31;
    fmt = "octal literals are deprecated in strict mode";
    goto LAB_00144d51;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
switchD_0014466b_caseD_31:
    v = js_atof(s->ctx,(char *)pbStack_38,(char **)&pbStack_38,0,0x34);
    if ((int)v.tag == 6) goto LAB_00144d5b;
    if (((ulong)v.u.ptr & 0x7fffffffffffffff) < 0x7ff0000000000001 || v.tag != 7) {
      iVar5 = unicode_from_utf8(pbStack_38,6,&pbStack_48);
      iVar5 = lre_js_is_ident_next(iVar5);
      if (iVar5 == 0) {
        (s->token).val = -0x80;
        (s->token).u.str.str = v;
        goto LAB_00144e9a;
      }
    }
    JS_FreeValue(s->ctx,v);
    fmt = "invalid number literal";
    goto LAB_00144d51;
  case 0x3c:
    bVar2 = pbStack_38[1];
    if (bVar2 == 0x3c) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x76;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x6a;
      }
      goto LAB_00144e9a;
    }
    if (bVar2 == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x66;
      goto LAB_00144e9a;
    }
    if ((((bVar2 == 0x21) && (s->allow_html_comments != 0)) && (pbStack_38[2] == 0x2d)) &&
       (pbStack_38[3] == 0x2d)) goto LAB_001447ef;
LAB_0014498c:
    uVar7 = (uint)bVar1;
    break;
  case 0x3d:
    if (pbStack_38[1] == 0x3e) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x5c;
      goto LAB_00144e9a;
    }
    if (pbStack_38[1] == 0x3d) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x62;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -99;
      }
      goto LAB_00144e9a;
    }
    uVar7 = 0x3d;
    break;
  case 0x3e:
    if (pbStack_38[1] == 0x3e) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x75;
      }
      else if (pbStack_38[2] == 0x3e) {
        if (pbStack_38[3] == 0x3d) {
          pbStack_38 = pbStack_38 + 4;
          token->val = -0x74;
        }
        else {
          pbStack_38 = pbStack_38 + 3;
          token->val = -0x68;
        }
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x69;
      }
      goto LAB_00144e9a;
    }
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -100;
      goto LAB_00144e9a;
    }
    uVar7 = 0x3e;
    break;
  case 0x3f:
    uVar7 = 0x3f;
    if (pbStack_38[1] == 0x2e) {
      if (9 < (byte)(pbStack_38[2] - 0x30)) {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x59;
        goto LAB_00144e9a;
      }
    }
    else if (pbStack_38[1] == 0x3f) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x6d;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x5a;
      }
      goto LAB_00144e9a;
    }
    break;
  case 0x5c:
    uVar7 = 0x5c;
    if (pbStack_38[1] == 0x75) {
      pbStack_48 = pbStack_38 + 1;
      uVar4 = lre_parse_escape(&pbStack_48,1);
      if ((-1 < (int)uVar4) && (iVar5 = lre_js_is_ident_first(uVar4), iVar5 != 0)) {
        pbStack_38 = pbStack_48;
        BStack_3c = 1;
        goto LAB_0014484e;
      }
    }
    break;
  case 0x5e:
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x72;
      goto LAB_00144e9a;
    }
    uVar7 = 0x5e;
    break;
  case 0x60:
    iVar5 = js_parse_template_part(s,pbStack_38 + 1);
    if (iVar5 != 0) goto LAB_00144d5b;
    pbStack_38 = s->buf_ptr;
    goto LAB_00144e9a;
  case 0x7c:
    if (pbStack_38[1] == 0x7c) {
      if (pbStack_38[2] == 0x3d) {
        pbStack_38 = pbStack_38 + 3;
        token->val = -0x6e;
      }
      else {
        pbStack_38 = pbStack_38 + 2;
        token->val = -0x5e;
      }
      goto LAB_00144e9a;
    }
    if (pbStack_38[1] == 0x3d) {
      pbStack_38 = pbStack_38 + 2;
      token->val = -0x71;
      goto LAB_00144e9a;
    }
    uVar7 = 0x7c;
  }
  token->val = uVar7;
  pbStack_38 = pbStack_38 + 1;
  goto LAB_00144e9a;
code_r0x00144820:
  if (uVar4 == 0xffffffff) {
LAB_00144831:
    pbStack_38 = pbStack_38 + 1;
  }
  goto LAB_001447ef;
LAB_00144dac:
  iVar5 = lre_js_is_ident_first(uVar4);
  if (iVar5 == 0) {
    fmt = "unexpected character";
LAB_00144d51:
    js_parse_error(s,fmt);
LAB_00144d5b:
    token->val = -0x58;
    return -1;
  }
LAB_0014484a:
  BStack_3c = 0;
LAB_0014484e:
  JVar6 = parse_ident(s,&pbStack_38,&BStack_3c,uVar4,0);
  if (JVar6 == 0) goto LAB_00144d5b;
  (s->token).u.ident.atom = JVar6;
  (s->token).u.ident.has_escape = BStack_3c;
  (s->token).u.ident.is_reserved = 0;
  if (0x24 < JVar6) {
    if (JVar6 < 0x2e) {
      pJVar3 = s->cur_func;
      if ((pJVar3->js_mode & 1) == 0) {
        if (JVar6 == 0x2d) {
          if ((*(ushort *)&pJVar3->field_0x84 & 1) != 0) goto LAB_0014487e;
          if ((((*(ushort *)&pJVar3->field_0x84 & 0xff00) == 0x300) &&
              (pJVar3->in_function_body == 0)) && (pJVar3->parent != (JSFunctionDef *)0x0)) {
            bVar1 = pJVar3->parent->field_0x84 & 1;
joined_r0x00144fad:
            if (bVar1 != 0) goto LAB_0014487e;
          }
        }
LAB_00144922:
        token->val = -0x7d;
        goto LAB_00144e9a;
      }
    }
    else {
      if (JVar6 != 0x2e) goto LAB_00144922;
      if (s->is_module == 0) {
        pJVar3 = s->cur_func;
        if ((*(ushort *)&pJVar3->field_0x84 & 2) == 0) {
          if ((((*(ushort *)&pJVar3->field_0x84 & 0xff00) == 0x300) &&
              (pJVar3->in_function_body == 0)) && (pJVar3->parent != (JSFunctionDef *)0x0)) {
            bVar1 = pJVar3->parent->field_0x84 & 2;
            goto joined_r0x00144fad;
          }
          goto LAB_00144922;
        }
      }
    }
  }
LAB_0014487e:
  if (BStack_3c == 0) {
    token->val = JVar6 - 0x56;
  }
  else {
    (s->token).u.ident.is_reserved = 1;
    (s->token).val = -0x7d;
  }
LAB_00144e9a:
  s->buf_ptr = pbStack_38;
  return 0;
}

Assistant:

static int js_parse_expect_semi(JSParseState *s)
{
    if (s->token.val != ';') {
        /* automatic insertion of ';' */
        if (s->token.val == TOK_EOF || s->token.val == '}' || s->got_lf) {
            return 0;
        }
        return js_parse_error(s, "expecting '%c'", ';');
    }
    return next_token(s);
}